

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_motion_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                       h262_macroblock *mb,int s)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  int in_R8D;
  int t;
  int r;
  int dmv;
  int mfs;
  int mvc;
  vs_vlc_val *in_stack_00000058;
  uint32_t *in_stack_00000060;
  bitstream *in_stack_00000068;
  uint32_t in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_30;
  
  if (*(int *)(in_RDX + 0x34) == 3) {
    in_stack_ffffffffffffffbc = *(uint32_t *)(in_RCX + 0x18);
    if (in_stack_ffffffffffffffbc == 1) {
      local_30 = 2;
      iVar4 = 1;
      iVar3 = 0;
    }
    else if (in_stack_ffffffffffffffbc == 2) {
      local_30 = 1;
      iVar4 = 0;
      iVar3 = 0;
    }
    else {
      if (in_stack_ffffffffffffffbc != 3) {
        abort();
      }
      local_30 = 1;
      iVar4 = 0;
      iVar3 = 1;
    }
  }
  else {
    iVar3 = *(int *)(in_RCX + 0x1c);
    if (iVar3 == 1) {
      local_30 = 1;
      iVar4 = 1;
      iVar3 = 0;
    }
    else if (iVar3 == 2) {
      local_30 = 2;
      iVar4 = 1;
      iVar3 = 0;
    }
    else {
      if (iVar3 != 3) {
        abort();
      }
      local_30 = 1;
      iVar4 = 0;
      iVar3 = 1;
    }
  }
  iVar2 = 0;
  do {
    if (1 < iVar2) {
      return 0;
    }
    if (iVar2 < local_30) {
      if ((iVar4 != 0) &&
         (iVar1 = vs_u((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc), iVar1 != 0)) {
        return 1;
      }
      for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < 2;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
        if (iVar1 != 0) {
          return 1;
        }
        if (*(int *)(in_RCX + 0x38 + (long)iVar2 * 0x10 + (long)in_R8D * 8 +
                    (long)in_stack_ffffffffffffffc0 * 4) == 0) {
          iVar1 = vs_infer((bitstream *)CONCAT44(iVar4,iVar3),
                           (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          iVar1 = vs_u((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
          if (iVar1 != 0) {
            return 1;
          }
        }
        if ((iVar3 != 0) &&
           (iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058), iVar1 != 0)) {
          return 1;
        }
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer((bitstream *)CONCAT44(iVar4,iVar3),
                       (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int h262_motion_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	int mvc, mfs, dmv;
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
		switch (mb->frame_motion_type) {
			case H262_FRAME_MOTION_FIELD:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_FRAME:
				mvc = 1;
				mfs = 0;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	} else {
		switch (mb->field_motion_type) {
			case H262_FIELD_MOTION_FIELD:
				mvc = 1;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_16X8:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	}
	int r, t;
	for (r = 0; r < 2; r++) {
		if (r < mvc) {
			if (mfs)
				if (vs_u(str, &mb->motion_vertical_field_select[r][s], 1)) return 1;
			for (t = 0; t < 2; t++) {
				if (vs_vlc(str, &mb->motion_code[r][s][t], motion_code_vlc)) return 1;
				if (mb->motion_code[r][s][t]) {
					if (vs_u(str, &mb->motion_residual[r][s][t], picparm->f_code[s][t]-1)) return 1;
				} else {
					if (vs_infer(str, &mb->motion_residual[r][s][t], 0)) return 1;
				}
				if (dmv) {
					if (vs_vlc(str, &mb->dmvector[t], dmvector_vlc)) return 1;
				}
			}
		} else {
			if (vs_infer(str, &mb->motion_code[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_code[r][s][1], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][1], 0)) return 1;
		}
	}
	return 0;
}